

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O0

Result_conflict * __thiscall
CoreML::NeuralNetworkSpecValidator::validateStackLayer
          (Result_conflict *__return_storage_ptr__,NeuralNetworkSpecValidator *this,
          NeuralNetworkLayer *layer)

{
  bool bVar1;
  int iVar2;
  Tensor *pTVar3;
  string *psVar4;
  int64 iVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  undefined1 local_120 [8];
  string err_1;
  string local_d8;
  int rank1;
  int rank0;
  StackLayerParams *params;
  undefined1 local_70 [48];
  Result_conflict r;
  NeuralNetworkLayer *layer_local;
  NeuralNetworkSpecValidator *this_local;
  
  r._32_8_ = layer;
  Result::Result((Result *)(local_70 + 0x28));
  validateInputCount((Result_conflict *)local_70,(NeuralNetworkLayer *)r._32_8_,2,-1);
  Result::operator=((Result *)(local_70 + 0x28),(Result *)local_70);
  Result::~Result((Result *)local_70);
  bVar1 = Result::good((Result *)(local_70 + 0x28));
  if (bVar1) {
    validateOutputCount((Result_conflict *)&params,(NeuralNetworkLayer *)r._32_8_,1,1);
    Result::operator=((Result *)(local_70 + 0x28),(Result *)&params);
    Result::~Result((Result *)&params);
  }
  _rank1 = Specification::NeuralNetworkLayer::stack((NeuralNetworkLayer *)r._32_8_);
  iVar2 = Specification::NeuralNetworkLayer::inputtensor_size((NeuralNetworkLayer *)r._32_8_);
  if (0 < iVar2) {
    pTVar3 = Specification::NeuralNetworkLayer::inputtensor((NeuralNetworkLayer *)r._32_8_,0);
    local_d8._M_storage._M_storage._4_4_ = Specification::Tensor::rank(pTVar3);
    pTVar3 = Specification::NeuralNetworkLayer::inputtensor((NeuralNetworkLayer *)r._32_8_,1);
    local_d8._M_storage._M_storage._0_4_ = Specification::Tensor::rank(pTVar3);
    if (local_d8._M_storage._M_storage._4_4_ != local_d8._M_storage._M_storage._0_4_) {
      psVar4 = Specification::NeuralNetworkLayer::name_abi_cxx11_((NeuralNetworkLayer *)r._32_8_);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &err_1._M_storage,"Shapes of all inputs must match for \'",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)psVar4);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_d8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &err_1._M_storage,"\' layer.");
      std::__cxx11::string::~string((string *)&err_1._M_storage);
      Result::Result((Result *)__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_d8);
      err_1.super__Rb_tree_node_base._M_right._4_4_ = 1;
      std::__cxx11::string::~string((string *)&local_d8);
      goto LAB_00416415;
    }
    iVar5 = Specification::StackLayerParams::axis(_rank1);
    if ((iVar5 < (int)-(local_d8._M_storage._M_storage._4_4_ + 1)) ||
       (iVar5 = Specification::StackLayerParams::axis(_rank1),
       (int)(local_d8._M_storage._M_storage._4_4_ + 1) <= iVar5)) {
      psVar4 = Specification::NeuralNetworkLayer::name_abi_cxx11_((NeuralNetworkLayer *)r._32_8_);
      std::operator+(&local_140,
                     "Value of axis must be in the range [-rank(tensor), rank(tensor)] for \'",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)psVar4);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_120,
                     &local_140,"\' layer.");
      std::__cxx11::string::~string((string *)&local_140);
      Result::Result((Result *)__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_120);
      err_1.super__Rb_tree_node_base._M_right._4_4_ = 1;
      std::__cxx11::string::~string((string *)local_120);
      goto LAB_00416415;
    }
  }
  Result::Result((Result *)__return_storage_ptr__,(Result *)(local_70 + 0x28));
  err_1.super__Rb_tree_node_base._M_right._4_4_ = 1;
LAB_00416415:
  Result::~Result((Result *)(local_70 + 0x28));
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateStackLayer(const Specification::NeuralNetworkLayer& layer) {
    Result r;
    r = validateInputCount(layer, 2, -1);
    if (r.good()) {
        r = validateOutputCount(layer, 1, 1);
    }
    const auto& params = layer.stack();
    if (layer.inputtensor_size() > 0) {
        const int rank0 = static_cast<int>(layer.inputtensor(0).rank());
        const int rank1 = static_cast<int>(layer.inputtensor(1).rank());
        if (rank0 != rank1) {
            const std::string err = "Shapes of all inputs must match for '" + layer.name() + "' layer.";
            return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
        }
        if (!(params.axis() >= -(rank0 + 1) && params.axis() < rank0 + 1)) {
            const std::string err = "Value of axis must be in the range [-rank(tensor), rank(tensor)] for '" + layer.name() + "' layer.";
            return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
        }
    }
    return r;
}